

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::clone_impl<boost::exception_detail::bad_alloc_>::clone_impl
          (clone_impl<boost::exception_detail::bad_alloc_> *this,bad_alloc_ *x)

{
  *(undefined ***)&this->field_0x30 = &PTR___cxa_pure_virtual_00128f38;
  bad_alloc_::bad_alloc_(&this->super_bad_alloc_,x);
  (this->super_bad_alloc_).super_exception._vptr_exception = (_func_int **)0x129470;
  *(undefined8 *)&(this->super_bad_alloc_).super_bad_alloc = 0x1294a0;
  *(undefined8 *)&this->field_0x30 = 0x1294e0;
  copy_boost_exception((exception *)this,&x->super_exception);
  return;
}

Assistant:

clone_impl( clone_impl const & x, clone_tag ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }